

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_318430::PpuVram_increase_y_increases_fine_y_Test::TestBody
          (PpuVram_increase_y_increases_fine_y_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_78;
  Message local_70;
  unsigned_short local_66;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_38;
  unsigned_short local_2e;
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  PpuVram v;
  PpuVram_increase_y_increases_fine_y_Test *this_local;
  
  n_e_s::core::PpuVram::Register
            ((PpuVram *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6),0x4320);
  n_e_s::core::PpuVram::increase_y
            ((PpuVram *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  local_2c = 0x5320;
  local_2e = n_e_s::core::Register<unsigned_short>::value
                       ((Register<unsigned_short> *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 6));
  testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
            ((EqHelper *)local_28,"0b101\'00\'11001\'00000","v.value()",&local_2c,&local_2e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu_registers.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  n_e_s::core::PpuVram::increase_y
            ((PpuVram *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  local_64 = 0x6320;
  local_66 = n_e_s::core::Register<unsigned_short>::value
                       ((Register<unsigned_short> *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 6));
  testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
            ((EqHelper *)local_60,"0b110\'00\'11001\'00000","v.value()",&local_64,&local_66);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu_registers.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST(PpuVram, increase_y_increases_fine_y) {
    PpuVram v{0b100'00'11001'00000};
    v.increase_y();
    EXPECT_EQ(0b101'00'11001'00000, v.value());
    v.increase_y();
    EXPECT_EQ(0b110'00'11001'00000, v.value());
}